

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::compiler::Version::InternalSerializeWithCachedSizesToArray
          (Version *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  int32 iVar2;
  int size;
  char *data;
  string *value;
  UnknownFieldSet *unknown_fields;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  Version *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  puStack_40 = target;
  if ((uVar1 & 2) != 0) {
    iVar2 = major(this);
    puStack_40 = internal::WireFormatLite::WriteInt32ToArray(1,iVar2,target);
  }
  if ((uVar1 & 4) != 0) {
    iVar2 = minor(this);
    puStack_40 = internal::WireFormatLite::WriteInt32ToArray(2,iVar2,puStack_40);
  }
  if ((uVar1 & 8) != 0) {
    iVar2 = patch(this);
    puStack_40 = internal::WireFormatLite::WriteInt32ToArray(3,iVar2,puStack_40);
  }
  if ((uVar1 & 1) != 0) {
    suffix_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    suffix_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (data,size,SERIALIZE,"google.protobuf.compiler.Version.suffix");
    value = suffix_abi_cxx11_(this);
    puStack_40 = internal::WireFormatLite::WriteStringToArray(4,value,puStack_40);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = Version::unknown_fields(this);
    puStack_40 = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* Version::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.Version)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 major = 1;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->major(), target);
  }

  // optional int32 minor = 2;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->minor(), target);
  }

  // optional int32 patch = 3;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->patch(), target);
  }

  // optional string suffix = 4;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->suffix().data(), this->suffix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.Version.suffix");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        4, this->suffix(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.Version)
  return target;
}